

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::removeSatisfied(SimpSolver *this)

{
  uint uVar1;
  CRef cr;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  iVar4 = (this->super_Solver).clauses.sz;
  lVar7 = 0;
  iVar6 = 0;
  if (0 < iVar4) {
    iVar6 = 0;
    do {
      uVar1 = (this->super_Solver).clauses.data[lVar7];
      puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
      if ((puVar2[uVar1] & 3) == 0) {
        bVar3 = Solver::satisfied(&this->super_Solver,(Clause *)(puVar2 + uVar1));
        puVar2 = (this->super_Solver).clauses.data;
        cr = puVar2[lVar7];
        if (bVar3) {
          Solver::removeSatisfiedClause(&this->super_Solver,cr,true);
        }
        else {
          lVar5 = (long)iVar6;
          iVar6 = iVar6 + 1;
          puVar2[lVar5] = cr;
        }
      }
      lVar7 = lVar7 + 1;
      iVar4 = (this->super_Solver).clauses.sz;
    } while (lVar7 < iVar4);
    iVar6 = (int)lVar7 - iVar6;
  }
  if (0 < iVar6) {
    (this->super_Solver).clauses.sz = iVar4 - iVar6;
  }
  return;
}

Assistant:

void SimpSolver::removeSatisfied()
{
    int i, j;
    for (i = j = 0; i < clauses.size(); i++) {
        const Clause &c = ca[clauses[i]];
        if (c.mark() == 0) {
            if (satisfied(c)) {
                removeSatisfiedClause(clauses[i]);
            } else {
                clauses[j++] = clauses[i];
            }
        }
    }
    clauses.shrink(i - j);
}